

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

char * mkfuncname(lua_State *L,char *modname)

{
  char *pcVar1;
  char *pcVar2;
  char *extraout_RAX;
  
  pcVar1 = strchr(modname,0x2d);
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = modname;
  }
  pcVar2 = luaL_gsub(L,pcVar2,".","_");
  lua_pushfstring(L,"luaopen_%s",pcVar2);
  lua_remove(L,-2);
  return extraout_RAX;
}

Assistant:

static const char *mkfuncname (lua_State *L, const char *modname) {
  const char *funcname;
  const char *mark = strchr(modname, *LUA_IGMARK);
  if (mark) modname = mark + 1;
  funcname = luaL_gsub(L, modname, ".", LUA_OFSEP);
  funcname = lua_pushfstring(L, POF"%s", funcname);
  lua_remove(L, -2);  /* remove 'gsub' result */
  return funcname;
}